

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::CheckerVisitor::detectNullCPattern
          (CheckerVisitor *this,TreeOp op,Expr *cond,Expr **checkee)

{
  bool bVar1;
  TreeOp TVar2;
  BinExpr *pBVar3;
  BinExpr *this_00;
  Id *this_01;
  undefined8 *in_RCX;
  Expr *in_RDX;
  int in_ESI;
  Node *in_RDI;
  Expr *reciever;
  Expr *candidate;
  Expr *D;
  Expr *V;
  BinExpr *nullc;
  Expr *rhs;
  Expr *lhs;
  BinExpr *bin;
  Expr *in_stack_ffffffffffffff78;
  BinExpr *local_80;
  bool local_1;
  
  if (((((in_ESI == 0x20) || (in_ESI == 0x1e)) || (in_ESI == 0x1b)) ||
      ((in_ESI == 0x1a || (in_ESI == 0x1f)))) || (in_ESI == 0x1d)) {
    pBVar3 = Expr::asBinExpr(in_RDX);
    BinExpr::lhs(pBVar3);
    local_80 = (BinExpr *)deparen(in_stack_ffffffffffffff78);
    BinExpr::rhs(pBVar3);
    pBVar3 = (BinExpr *)deparen(in_stack_ffffffffffffff78);
    TVar2 = Node::op((Node *)local_80);
    if ((TVar2 == TO_NULLC) || (TVar2 = Node::op((Node *)pBVar3), TVar2 == TO_NULLC)) {
      TVar2 = Node::op((Node *)local_80);
      if (TVar2 == TO_NULLC) {
        this_00 = Expr::asBinExpr((Expr *)local_80);
      }
      else {
        this_00 = Expr::asBinExpr((Expr *)pBVar3);
      }
      if (local_80 == this_00) {
        local_80 = pBVar3;
      }
      pBVar3 = this_00;
      BinExpr::rhs(this_00);
      deparen(in_stack_ffffffffffffff78);
      BinExpr::lhs(this_00);
      deparen(in_stack_ffffffffffffff78);
      this_01 = extractReceiver((Expr *)in_RDI);
      if (this_01 == (Id *)0x0) {
        local_1 = false;
      }
      else {
        TVar2 = Node::op((Node *)local_80);
        if ((TVar2 == TO_ID) ||
           (bVar1 = NodeEqualChecker::check((NodeEqualChecker *)this_01,in_RDI,(Node *)pBVar3),
           bVar1)) {
          *in_RCX = this_01;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CheckerVisitor::detectNullCPattern(enum TreeOp op, const Expr *cond, const Expr *&checkee) {

  // detect patterns like `(o?.x ?? D) <op> D` which implies o not null

  // (o?.f ?? D) != V -- then-branch implies `o` non-null
  // (o?.f ?? D) == V -- assume else-branch implies `o` non-null
  // (o?.f ?? D) > V -- then-b implies `o` non-null
  // (o?.f ?? D) < V -- then-b implies `o` non-null
  // (o?.f ?? D) >= V -- else-branch implies `o` non-null
  // (o?.f ?? D) <= V -- else-branch implies `o` non-null

  if (op != TO_LT && op != TO_GT && op != TO_EQ && op != TO_NE && op != TO_LE && op != TO_GE) {
    return false;
  }

  const BinExpr *bin = cond->asBinExpr();

  const Expr *lhs = deparen(bin->lhs());
  const Expr *rhs = deparen(bin->rhs());

  if (lhs->op() != TO_NULLC && rhs->op() != TO_NULLC) // -V522
    return false;

  const BinExpr *nullc = lhs->op() == TO_NULLC ? lhs->asBinExpr() : rhs->asBinExpr();
  const Expr *V = lhs == nullc ? rhs : lhs;
  const Expr *D = deparen(nullc->rhs());
  const Expr *candidate = deparen(nullc->lhs());

  const Expr *reciever = extractReceiver(candidate);

  if (reciever == nullptr)
    return false;

  if (V->op() == TO_ID || _equalChecker.check(D, V)) { // -V522
    checkee = reciever;
    return true;
  }

  return false;
}